

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_starts_withi_Test<std::pair<char,_char16_t>_>::UnicodeFullTest_starts_withi_Test
          (UnicodeFullTest_starts_withi_Test<std::pair<char,_char16_t>_> *this)

{
  UnicodeFullTest_starts_withi_Test<std::pair<char,_char16_t>_> *this_local;
  
  UnicodeFullTest<std::pair<char,_char16_t>_>::UnicodeFullTest
            (&this->super_UnicodeFullTest<std::pair<char,_char16_t>_>);
  *(undefined ***)&this->super_UnicodeFullTest<std::pair<char,_char16_t>_> =
       &PTR__UnicodeFullTest_starts_withi_Test_00816140;
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_withi) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les Bean")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"del")));
}